

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this,
          Descriptor *descriptor)

{
  int iVar1;
  Descriptor *descriptor_local;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this_local;
  
  this->descriptor_ = descriptor;
  std::
  vector<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ::vector(&this->field_generators_);
  iVar1 = Descriptor::field_count(descriptor);
  std::
  vector<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ::reserve(&this->field_generators_,(long)iVar1);
  return;
}

Assistant:

explicit FieldGeneratorMap(const Descriptor* descriptor)
      : descriptor_(descriptor) {
    field_generators_.reserve(static_cast<size_t>(descriptor->field_count()));
  }